

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

EStatusCode __thiscall
PDFWriter::SetupStateFromModifiedStream
          (PDFWriter *this,IByteReaderWithPosition *inModifiedSourceStream,EPDFVersion inPDFVersion,
          PDFCreationSettings *inPDFCreationSettings)

{
  undefined4 uVar1;
  bool bVar2;
  undefined1 local_50 [8];
  PDFParsingOptions parsingOptions;
  EStatusCode status;
  EPDFVersion pdfVersion;
  PDFCreationSettings *inPDFCreationSettings_local;
  EPDFVersion inPDFVersion_local;
  IByteReaderWithPosition *inModifiedSourceStream_local;
  PDFWriter *this_local;
  
  parsingOptions.Password.field_2._12_4_ =
       thisOrDefaultVersion(inPDFVersion,(bool)(inPDFCreationSettings->WriteXrefAsXrefStream & 1));
  PDFParsingOptions::PDFParsingOptions((PDFParsingOptions *)local_50);
  if (((inPDFCreationSettings->DocumentEncryptionOptions).ShouldEncrypt & 1U) != 0) {
    std::__cxx11::string::operator=
              ((string *)local_50,
               (string *)&(inPDFCreationSettings->DocumentEncryptionOptions).UserPassword);
  }
  parsingOptions.Password.field_2._8_4_ =
       PDFParser::StartPDFParsing
                 (&this->mModifiedFileParser,inModifiedSourceStream,(PDFParsingOptions *)local_50);
  if (parsingOptions.Password.field_2._8_4_ == eSuccess) {
    ObjectsContext::SetupModifiedFile(&this->mObjectsContext,&this->mModifiedFileParser);
    parsingOptions.Password.field_2._8_4_ =
         PDFHummus::DocumentContext::SetupModifiedFile
                   (&this->mDocumentContext,&this->mModifiedFileParser);
    if (parsingOptions.Password.field_2._8_4_ == eSuccess) {
      bVar2 = PDFParser::IsEncrypted(&this->mModifiedFileParser);
      if ((bVar2) && (bVar2 = PDFParser::IsEncryptionSupported(&this->mModifiedFileParser), bVar2))
      {
        PDFHummus::DocumentContext::SetupEncryption
                  (&this->mDocumentContext,&this->mModifiedFileParser);
        bVar2 = PDFHummus::DocumentContext::SupportsEncryption(&this->mDocumentContext);
        if (!bVar2) {
          parsingOptions.Password.field_2._8_4_ = 0xffffffff;
          goto LAB_00269004;
        }
      }
      this->mModifiedFileVersion = parsingOptions.Password.field_2._12_4_;
    }
  }
LAB_00269004:
  uVar1 = parsingOptions.Password.field_2._8_4_;
  PDFParsingOptions::~PDFParsingOptions((PDFParsingOptions *)local_50);
  return uVar1;
}

Assistant:

EStatusCode PDFWriter::SetupStateFromModifiedStream(IByteReaderWithPosition* inModifiedSourceStream,
                                                    EPDFVersion inPDFVersion,
													const PDFCreationSettings& inPDFCreationSettings)
{
	EPDFVersion pdfVersion = thisOrDefaultVersion(inPDFVersion, inPDFCreationSettings.WriteXrefAsXrefStream);
    EStatusCode status;
	PDFParsingOptions parsingOptions;

	// this bit here is actually interesting. in order to modify an already encrypted document
	// and add more content to it, i just need the user password. not the owner one.
	// in fact, passing the owner password here will create the wrong encryption key.
	// interesting.
	if (inPDFCreationSettings.DocumentEncryptionOptions.ShouldEncrypt)
		parsingOptions.Password = inPDFCreationSettings.DocumentEncryptionOptions.UserPassword;

    do
    {
        status = mModifiedFileParser.StartPDFParsing(inModifiedSourceStream, parsingOptions);
        if(status != eSuccess)
            break;

        mObjectsContext.SetupModifiedFile(&mModifiedFileParser);

        status = mDocumentContext.SetupModifiedFile(&mModifiedFileParser);
        if(status != eSuccess)
            break;

		if (mModifiedFileParser.IsEncrypted() && mModifiedFileParser.IsEncryptionSupported()) {
			mDocumentContext.SetupEncryption(&mModifiedFileParser);
			if (!mDocumentContext.SupportsEncryption()) {
				status = eFailure;
				break;
			}
		}

        mModifiedFileVersion = pdfVersion;
    }
    while (false);

    return status;
}